

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QByteArray,QByteArray>>::emplace<QByteArray_const&,QByteArray>
          (QMovableArrayOps<std::pair<QByteArray,_QByteArray>_> *this,qsizetype i,QByteArray *args,
          QByteArray *args_1)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  pair<QByteArray,_QByteArray> *in_RCX;
  undefined8 in_RDX;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *in_RSI;
  pair<QByteArray,_QByteArray> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  pair<QByteArray,_QByteArray> tmp;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7e;
  byte bVar6;
  GrowthPosition where;
  Inserter local_60;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::needsDetach
                    ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)(in_RDI->first).d.size)
       && (qVar3 = QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::freeSpaceAtEnd
                             ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)
                              CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff7e,
                                                      CONCAT24(in_stack_ffffffffffffff7c,
                                                               in_stack_ffffffffffffff78)))),
          qVar3 != 0)) {
      QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::end
                ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)in_RDI);
      std::pair<QByteArray,_QByteArray>::pair<QByteArray,_true>
                (in_RCX,(QByteArray *)
                        CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff7e,
                                                CONCAT24(in_stack_ffffffffffffff7c,
                                                         in_stack_ffffffffffffff78))),&in_RDI->first
                );
      (in_RDI->first).d.size = (in_RDI->first).d.size + 1;
      goto LAB_00202219;
    }
    if ((in_RSI == (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0) &&
       (qVar3 = QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::freeSpaceAtBegin
                          ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff7e,
                                                   CONCAT24(in_stack_ffffffffffffff7c,
                                                            in_stack_ffffffffffffff78)))),
       qVar3 != 0)) {
      QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::begin
                ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x202084);
      std::pair<QByteArray,_QByteArray>::pair<QByteArray,_true>
                (in_RCX,(QByteArray *)
                        CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff7e,
                                                CONCAT24(in_stack_ffffffffffffff7c,
                                                         in_stack_ffffffffffffff78))),&in_RDI->first
                );
      (in_RDI->first).d.ptr = (char *)((pair<QByteArray,_QByteArray> *)(in_RDI->first).d.ptr + -1);
      (in_RDI->first).d.size = (in_RDI->first).d.size + 1;
      goto LAB_00202219;
    }
  }
  memset(&local_38,0,0x30);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  std::pair<QByteArray,_QByteArray>::pair<QByteArray,_true>
            (in_RCX,(QByteArray *)
                    CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff7e,
                                            CONCAT24(in_stack_ffffffffffffff7c,
                                                     in_stack_ffffffffffffff78))),&in_RDI->first);
  bVar4 = (in_RDI->first).d.size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::detachAndGrow
            (in_RSI,where,(qsizetype)in_RCX,
             (pair<QByteArray,_QByteArray> **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff7c,uVar2))),
             (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    QMovableArrayOps<std::pair<QByteArray,_QByteArray>_>::Inserter::Inserter
              ((Inserter *)in_RCX,
               (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)
               CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff7c,uVar2))),
               (qsizetype)in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff68));
    QMovableArrayOps<std::pair<QByteArray,_QByteArray>_>::Inserter::insertOne
              ((Inserter *)in_RDI,
               (pair<QByteArray,_QByteArray> *)CONCAT17(uVar5,in_stack_ffffffffffffff68));
    QMovableArrayOps<std::pair<QByteArray,_QByteArray>_>::Inserter::~Inserter(&local_60);
  }
  else {
    QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::begin
              ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x2021ad);
    std::pair<QByteArray,_QByteArray>::pair
              (in_RDI,(pair<QByteArray,_QByteArray> *)CONCAT17(uVar5,in_stack_ffffffffffffff68));
    (in_RDI->first).d.ptr = (in_RDI->first).d.ptr + -0x30;
    (in_RDI->first).d.size = (in_RDI->first).d.size + 1;
  }
  std::pair<QByteArray,_QByteArray>::~pair(in_RDI);
LAB_00202219:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }